

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O3

char * doctest::detail::getAssertString(Enum val)

{
  if ((int)val < 0x242) {
    if ((int)val < 0x101) {
      if ((int)val < 0x21) {
        switch(val) {
        case DT_WARN:
          return "WARN";
        case DT_CHECK:
          return "CHECK";
        case DT_REQUIRE:
          return "REQUIRE";
        case DT_WARN_THROWS:
          return "WARN_THROWS";
        case DT_CHECK_THROWS:
          return "CHECK_THROWS";
        case DT_REQUIRE_THROWS:
          return "REQUIRE_THROWS";
        case DT_WARN_THROWS_AS:
          return "WARN_THROWS_AS";
        case DT_CHECK_THROWS_AS:
          return "CHECK_THROWS_AS";
        case DT_REQUIRE_THROWS_AS:
          return "REQUIRE_THROWS_AS";
        }
      }
      else if ((int)val < 0x81) {
        if (val == DT_WARN_NOTHROW) {
          return "WARN_NOTHROW";
        }
        if (val == DT_CHECK_NOTHROW) {
          return "CHECK_NOTHROW";
        }
        if (val == DT_REQUIRE_NOTHROW) {
          return "REQUIRE_NOTHROW";
        }
      }
      else {
        if (val == DT_WARN_FALSE) {
          return "WARN_FALSE";
        }
        if (val == DT_CHECK_FALSE) {
          return "CHECK_FALSE";
        }
        if (val == DT_REQUIRE_FALSE) {
          return "REQUIRE_FALSE";
        }
      }
    }
    else if ((int)val < 0x184) {
      if ((int)val < 0x142) {
        if ((int)val < 0x104) {
          if (val == DT_WARN_UNARY) {
            return "WARN_UNARY";
          }
          if (val == DT_CHECK_UNARY) {
            return "CHECK_UNARY";
          }
        }
        else {
          if (val == DT_REQUIRE_UNARY) {
            return "REQUIRE_UNARY";
          }
          if (val == DT_FAST_WARN_UNARY) {
            return "FAST_WARN_UNARY";
          }
        }
      }
      else if ((int)val < 0x181) {
        if (val == DT_FAST_CHECK_UNARY) {
          return "FAST_CHECK_UNARY";
        }
        if (val == DT_FAST_REQUIRE_UNARY) {
          return "FAST_REQUIRE_UNARY";
        }
      }
      else {
        if (val == DT_WARN_UNARY_FALSE) {
          return "WARN_UNARY_FALSE";
        }
        if (val == DT_CHECK_UNARY_FALSE) {
          return "CHECK_UNARY_FALSE";
        }
      }
    }
    else if ((int)val < 0x201) {
      if ((int)val < 0x1c2) {
        if (val == DT_REQUIRE_UNARY_FALSE) {
          return "REQUIRE_UNARY_FALSE";
        }
        if (val == DT_FAST_WARN_UNARY_FALSE) {
          return "FAST_WARN_UNARY_FALSE";
        }
      }
      else {
        if (val == DT_FAST_CHECK_UNARY_FALSE) {
          return "FAST_CHECK_UNARY_FALSE";
        }
        if (val == DT_FAST_REQUIRE_UNARY_FALSE) {
          return "FAST_REQUIRE_UNARY_FALSE";
        }
      }
    }
    else if ((int)val < 0x204) {
      if (val == DT_WARN_EQ) {
        return "WARN_EQ";
      }
      if (val == DT_CHECK_EQ) {
        return "CHECK_EQ";
      }
    }
    else {
      if (val == DT_REQUIRE_EQ) {
        return "REQUIRE_EQ";
      }
      if (val == DT_FAST_WARN_EQ) {
        return "FAST_WARN_EQ";
      }
    }
  }
  else if ((int)val < 0x1004) {
    if ((int)val < 0x801) {
      if ((int)val < 0x404) {
        if ((int)val < 0x401) {
          if (val == DT_FAST_CHECK_EQ) {
            return "FAST_CHECK_EQ";
          }
          if (val == DT_FAST_REQUIRE_EQ) {
            return "FAST_REQUIRE_EQ";
          }
        }
        else {
          if (val == DT_WARN_NE) {
            return "WARN_NE";
          }
          if (val == DT_CHECK_NE) {
            return "CHECK_NE";
          }
        }
      }
      else if ((int)val < 0x442) {
        if (val == DT_REQUIRE_NE) {
          return "REQUIRE_NE";
        }
        if (val == DT_FAST_WARN_NE) {
          return "FAST_WARN_NE";
        }
      }
      else {
        if (val == DT_FAST_CHECK_NE) {
          return "FAST_CHECK_NE";
        }
        if (val == DT_FAST_REQUIRE_NE) {
          return "FAST_REQUIRE_NE";
        }
      }
    }
    else if ((int)val < 0x842) {
      if ((int)val < 0x804) {
        if (val == DT_WARN_LT) {
          return "WARN_LT";
        }
        if (val == DT_CHECK_LT) {
          return "CHECK_LT";
        }
      }
      else {
        if (val == DT_REQUIRE_LT) {
          return "REQUIRE_LT";
        }
        if (val == DT_FAST_WARN_LT) {
          return "FAST_WARN_LT";
        }
      }
    }
    else if ((int)val < 0x1001) {
      if (val == DT_FAST_CHECK_LT) {
        return "FAST_CHECK_LT";
      }
      if (val == DT_FAST_REQUIRE_LT) {
        return "FAST_REQUIRE_LT";
      }
    }
    else {
      if (val == DT_WARN_GT) {
        return "WARN_GT";
      }
      if (val == DT_CHECK_GT) {
        return "CHECK_GT";
      }
    }
  }
  else if ((int)val < 0x2042) {
    if ((int)val < 0x2001) {
      if ((int)val < 0x1042) {
        if (val == DT_REQUIRE_GT) {
          return "REQUIRE_GT";
        }
        if (val == DT_FAST_WARN_GT) {
          return "FAST_WARN_GT";
        }
      }
      else {
        if (val == DT_FAST_CHECK_GT) {
          return "FAST_CHECK_GT";
        }
        if (val == DT_FAST_REQUIRE_GT) {
          return "FAST_REQUIRE_GT";
        }
      }
    }
    else if ((int)val < 0x2004) {
      if (val == DT_WARN_GE) {
        return "WARN_GE";
      }
      if (val == DT_CHECK_GE) {
        return "CHECK_GE";
      }
    }
    else {
      if (val == DT_REQUIRE_GE) {
        return "REQUIRE_GE";
      }
      if (val == DT_FAST_WARN_GE) {
        return "FAST_WARN_GE";
      }
    }
  }
  else if ((int)val < 0x4004) {
    if ((int)val < 0x4001) {
      if (val == DT_FAST_CHECK_GE) {
        return "FAST_CHECK_GE";
      }
      if (val == DT_FAST_REQUIRE_GE) {
        return "FAST_REQUIRE_GE";
      }
    }
    else {
      if (val == DT_WARN_LE) {
        return "WARN_LE";
      }
      if (val == DT_CHECK_LE) {
        return "CHECK_LE";
      }
    }
  }
  else if ((int)val < 0x4042) {
    if (val == DT_REQUIRE_LE) {
      return "REQUIRE_LE";
    }
    if (val == DT_FAST_WARN_LE) {
      return "FAST_WARN_LE";
    }
  }
  else {
    if (val == DT_FAST_CHECK_LE) {
      return "FAST_CHECK_LE";
    }
    if (val == DT_FAST_REQUIRE_LE) {
      return "FAST_REQUIRE_LE";
    }
  }
  return "";
}

Assistant:

const char* getAssertString(assertType::Enum val) {
        switch(val) {
            // clang-format off
            case assertType::DT_WARN                    : return "WARN";
            case assertType::DT_CHECK                   : return "CHECK";
            case assertType::DT_REQUIRE                 : return "REQUIRE";

            case assertType::DT_WARN_FALSE              : return "WARN_FALSE";
            case assertType::DT_CHECK_FALSE             : return "CHECK_FALSE";
            case assertType::DT_REQUIRE_FALSE           : return "REQUIRE_FALSE";

            case assertType::DT_WARN_THROWS             : return "WARN_THROWS";
            case assertType::DT_CHECK_THROWS            : return "CHECK_THROWS";
            case assertType::DT_REQUIRE_THROWS          : return "REQUIRE_THROWS";

            case assertType::DT_WARN_THROWS_AS          : return "WARN_THROWS_AS";
            case assertType::DT_CHECK_THROWS_AS         : return "CHECK_THROWS_AS";
            case assertType::DT_REQUIRE_THROWS_AS       : return "REQUIRE_THROWS_AS";

            case assertType::DT_WARN_NOTHROW            : return "WARN_NOTHROW";
            case assertType::DT_CHECK_NOTHROW           : return "CHECK_NOTHROW";
            case assertType::DT_REQUIRE_NOTHROW         : return "REQUIRE_NOTHROW";

            case assertType::DT_WARN_EQ                 : return "WARN_EQ";
            case assertType::DT_CHECK_EQ                : return "CHECK_EQ";
            case assertType::DT_REQUIRE_EQ              : return "REQUIRE_EQ";
            case assertType::DT_WARN_NE                 : return "WARN_NE";
            case assertType::DT_CHECK_NE                : return "CHECK_NE";
            case assertType::DT_REQUIRE_NE              : return "REQUIRE_NE";
            case assertType::DT_WARN_GT                 : return "WARN_GT";
            case assertType::DT_CHECK_GT                : return "CHECK_GT";
            case assertType::DT_REQUIRE_GT              : return "REQUIRE_GT";
            case assertType::DT_WARN_LT                 : return "WARN_LT";
            case assertType::DT_CHECK_LT                : return "CHECK_LT";
            case assertType::DT_REQUIRE_LT              : return "REQUIRE_LT";
            case assertType::DT_WARN_GE                 : return "WARN_GE";
            case assertType::DT_CHECK_GE                : return "CHECK_GE";
            case assertType::DT_REQUIRE_GE              : return "REQUIRE_GE";
            case assertType::DT_WARN_LE                 : return "WARN_LE";
            case assertType::DT_CHECK_LE                : return "CHECK_LE";
            case assertType::DT_REQUIRE_LE              : return "REQUIRE_LE";

            case assertType::DT_WARN_UNARY              : return "WARN_UNARY";
            case assertType::DT_CHECK_UNARY             : return "CHECK_UNARY";
            case assertType::DT_REQUIRE_UNARY           : return "REQUIRE_UNARY";
            case assertType::DT_WARN_UNARY_FALSE        : return "WARN_UNARY_FALSE";
            case assertType::DT_CHECK_UNARY_FALSE       : return "CHECK_UNARY_FALSE";
            case assertType::DT_REQUIRE_UNARY_FALSE     : return "REQUIRE_UNARY_FALSE";

            case assertType::DT_FAST_WARN_EQ            : return "FAST_WARN_EQ";
            case assertType::DT_FAST_CHECK_EQ           : return "FAST_CHECK_EQ";
            case assertType::DT_FAST_REQUIRE_EQ         : return "FAST_REQUIRE_EQ";
            case assertType::DT_FAST_WARN_NE            : return "FAST_WARN_NE";
            case assertType::DT_FAST_CHECK_NE           : return "FAST_CHECK_NE";
            case assertType::DT_FAST_REQUIRE_NE         : return "FAST_REQUIRE_NE";
            case assertType::DT_FAST_WARN_GT            : return "FAST_WARN_GT";
            case assertType::DT_FAST_CHECK_GT           : return "FAST_CHECK_GT";
            case assertType::DT_FAST_REQUIRE_GT         : return "FAST_REQUIRE_GT";
            case assertType::DT_FAST_WARN_LT            : return "FAST_WARN_LT";
            case assertType::DT_FAST_CHECK_LT           : return "FAST_CHECK_LT";
            case assertType::DT_FAST_REQUIRE_LT         : return "FAST_REQUIRE_LT";
            case assertType::DT_FAST_WARN_GE            : return "FAST_WARN_GE";
            case assertType::DT_FAST_CHECK_GE           : return "FAST_CHECK_GE";
            case assertType::DT_FAST_REQUIRE_GE         : return "FAST_REQUIRE_GE";
            case assertType::DT_FAST_WARN_LE            : return "FAST_WARN_LE";
            case assertType::DT_FAST_CHECK_LE           : return "FAST_CHECK_LE";
            case assertType::DT_FAST_REQUIRE_LE         : return "FAST_REQUIRE_LE";

            case assertType::DT_FAST_WARN_UNARY         : return "FAST_WARN_UNARY";
            case assertType::DT_FAST_CHECK_UNARY        : return "FAST_CHECK_UNARY";
            case assertType::DT_FAST_REQUIRE_UNARY      : return "FAST_REQUIRE_UNARY";
            case assertType::DT_FAST_WARN_UNARY_FALSE   : return "FAST_WARN_UNARY_FALSE";
            case assertType::DT_FAST_CHECK_UNARY_FALSE  : return "FAST_CHECK_UNARY_FALSE";
            case assertType::DT_FAST_REQUIRE_UNARY_FALSE: return "FAST_REQUIRE_UNARY_FALSE";
                // clang-format on
        }
        return "";
    }